

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

string * __thiscall
duckdb::RenderTiming_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,double timing)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string timing_s;
  string local_c0;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  string local_80;
  string local_60;
  string local_40;
  
  local_98 = 0;
  local_90[0] = 0;
  local_a0 = local_90;
  if (1.0 <= timing) {
    paVar2 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%.2f","");
    Exception::ConstructMessage<double>(&local_c0,&local_40,timing);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    _Var1._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      _Var1._M_p = local_40._M_dataplus._M_p;
    }
  }
  else if (0.1 <= timing) {
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"%.3f","");
    Exception::ConstructMessage<double>(&local_c0,&local_60,timing);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    _Var1._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      _Var1._M_p = local_60._M_dataplus._M_p;
    }
  }
  else {
    paVar2 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"%.4f","");
    Exception::ConstructMessage<double>(&local_c0,&local_80,timing);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    _Var1._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      _Var1._M_p = local_80._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_a0,local_a0 + local_98);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

static string RenderTiming(double timing) {
	string timing_s;
	if (timing >= 1) {
		timing_s = StringUtil::Format("%.2f", timing);
	} else if (timing >= 0.1) {
		timing_s = StringUtil::Format("%.3f", timing);
	} else {
		timing_s = StringUtil::Format("%.4f", timing);
	}
	return timing_s + "s";
}